

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactContainerNSC.cpp
# Opt level: O3

void chrono::
     _OptimalContactInsert<chrono::ChContactNSC<chrono::ChContactable_3vars<3,3,3>,chrono::ChContactable_1vars<3>>,std::_List_iterator<chrono::ChContactNSC<chrono::ChContactable_3vars<3,3,3>,chrono::ChContactable_1vars<3>>*>,chrono::ChContactable_3vars<3,3,3>,chrono::ChContactable_1vars<3>>
               (list<chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>_*>_>
                *contactlist,
               _List_iterator<chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>_*>
               *lastcontact,int *n_added,ChContactContainer *container,
               ChContactable_3vars<3,_3,_3> *objA,ChContactable_1vars<3> *objB,
               ChCollisionInfo *cinfo,ChMaterialCompositeNSC *cmat)

{
  size_t *psVar1;
  ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_> *this;
  _List_node_base *p_Var2;
  
  if (lastcontact->_M_node == (_List_node_base *)contactlist) {
    this = (ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_> *)
           ::operator_new(0x498);
    ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>::
    ChContactNSC(this,container,objA,objB,cinfo,cmat);
    p_Var2 = (_List_node_base *)::operator_new(0x18);
    p_Var2[1]._M_next = (_List_node_base *)this;
    std::__detail::_List_node_base::_M_hook(p_Var2);
    psVar1 = &(contactlist->
              super__List_base<chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>_*>_>
              )._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    p_Var2 = lastcontact->_M_node[1]._M_next;
    (*(code *)p_Var2->_M_next[8]._M_next)(p_Var2,objA,objB,cinfo,cmat);
    contactlist = (list<chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>_*>_>
                   *)lastcontact->_M_node->_M_next;
  }
  lastcontact->_M_node = (_List_node_base *)contactlist;
  *n_added = *n_added + 1;
  return;
}

Assistant:

void _OptimalContactInsert(std::list<Tcont*>& contactlist,           // contact list
                           Titer& lastcontact,                       // last contact acquired
                           int& n_added,                             // number of contacts inserted
                           ChContactContainer* container,            // contact container
                           Ta* objA,                                 // collidable object A
                           Tb* objB,                                 // collidable object B
                           const collision::ChCollisionInfo& cinfo,  // collision information
                           const ChMaterialCompositeNSC& cmat        // composite material
) {
    if (lastcontact != contactlist.end()) {
        // reuse old contacts
        (*lastcontact)->Reset(objA, objB, cinfo, cmat);
        lastcontact++;
    } else {
        // add new contact
        Tcont* mc = new Tcont(container, objA, objB, cinfo, cmat);
        contactlist.push_back(mc);
        lastcontact = contactlist.end();
    }
    n_added++;
}